

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::UnbasedUnsizedIntegerLiteral::serializeTo
          (UnbasedUnsizedIntegerLiteral *this,ASTSerializer *serializer)

{
  undefined1 local_60 [56];
  basic_string_view<char,_std::char_traits<char>_> local_28;
  ASTSerializer *local_18;
  ASTSerializer *serializer_local;
  UnbasedUnsizedIntegerLiteral *this_local;
  
  local_18 = serializer;
  serializer_local = (ASTSerializer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"value");
  getValue((UnbasedUnsizedIntegerLiteral *)local_60);
  slang::ConstantValue::ConstantValue((ConstantValue *)(local_60 + 0x10),(SVInt *)local_60);
  ASTSerializer::write(serializer,(int)local_28._M_len,local_28._M_str,(size_t)(local_60 + 0x10));
  slang::ConstantValue::~ConstantValue((ConstantValue *)(local_60 + 0x10));
  SVInt::~SVInt((SVInt *)local_60);
  return;
}

Assistant:

void UnbasedUnsizedIntegerLiteral::serializeTo(ASTSerializer& serializer) const {
    serializer.write("value", getValue());
}